

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HApp.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  char *pcVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  size_t sVar12;
  ostream *poVar13;
  char cVar14;
  bool bVar15;
  HModel model;
  HTester tester;
  double dStack_15d20;
  char *pcStack_15d00;
  char *pcStack_15cf8;
  char *pcStack_15cf0;
  double dStack_15ce8;
  char *pcStack_15ce0;
  char *pcStack_15cd8;
  undefined4 auStack_15cd0 [4];
  undefined4 uStack_15cc0;
  double dStack_15c90;
  undefined1 auStack_14b40 [16];
  undefined8 uStack_14b30;
  undefined1 auStack_14b28 [24];
  void *pvStack_14b10;
  undefined8 uStack_14b08;
  pointer piStack_14b00;
  pointer piStack_14af8;
  pointer piStack_14af0;
  undefined8 uStack_14ae8;
  HModel *pHStack_14ae0;
  double dStack_14ad8;
  double dStack_14ad0;
  HModel aHStack_14ac8 [84632];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "====================================================================================",
             0x54);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Running hsol",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  if ((argc == 4) && (iVar10 = strcmp(argv[1],"-repeat"), iVar10 == 0)) {
    uStack_14b30._0_1_ = false;
    uStack_14b30._1_7_ = 0;
    auStack_14b28[0] = 0;
    pvStack_14b10 = (void *)0x0;
    uStack_14b08._0_1_ = false;
    uStack_14b08._1_7_ = 0;
    piStack_14b00 = (pointer)0x0;
    piStack_14af8 = (pointer)0x0;
    piStack_14af0 = (pointer)0x0;
    uStack_14ae8._0_1_ = false;
    uStack_14ae8._1_3_ = 0;
    uStack_14ae8._4_4_ = 0;
    pHStack_14ae0 = (HModel *)0x0;
    dStack_14ad8 = 0.0;
    dStack_14ad0 = 0.0;
    auStack_14b40._8_8_ = auStack_14b28;
    HModel::HModel(aHStack_14ac8);
    HTester::setup(auStack_14b40);
    atoi(argv[3]);
    HTester::testUpdate((int)auStack_14b40);
    HModel::~HModel(aHStack_14ac8);
    if (pHStack_14ae0 != (HModel *)0x0) {
      operator_delete(pHStack_14ae0);
    }
    if (piStack_14af8 != (pointer)0x0) {
      operator_delete(piStack_14af8);
    }
    if (pvStack_14b10 != (void *)0x0) {
      operator_delete(pvStack_14b10);
    }
    if ((undefined1 *)auStack_14b40._8_8_ != auStack_14b28) {
      operator_delete((void *)auStack_14b40._8_8_);
    }
    return 0;
  }
  dStack_15ce8 = 1e+200;
  dStack_15d20 = 0.0;
  bVar15 = false;
  bVar3 = false;
  bVar4 = false;
  bVar6 = false;
  bVar5 = false;
  bVar7 = false;
  pcStack_15cf0 = "";
  pcStack_15cf8 = "";
  pcStack_15cd8 = "";
  pcStack_15d00 = "";
  pcStack_15ce0 = (char *)0x0;
  bVar2 = false;
  bVar9 = false;
switchD_0010378c_caseD_73:
  while( true ) {
    bVar1 = bVar9;
    iVar10 = getopt(argc,argv,"p:c:e:sSm::t:T:df:");
    if (0x53 < iVar10) break;
    if (iVar10 != 0x53) {
      if (iVar10 == -1) {
        if (!bVar2) {
          pcStack_15cd8 = "ml.mps";
          printf("Setting default value filenameMode = %s\n","ml.mps");
        }
        if (!bVar15) {
          pcStack_15cf0 = "Off";
          printf("Setting default value presolveMode = %s\n");
        }
        if (!bVar3) {
          pcStack_15d00 = "Off";
          printf("Setting default value crashMode = %s\n");
        }
        if (!bVar4) {
          pcStack_15cf8 = "DSE1";
          printf("Setting default value edWtMode = %s\n");
        }
        if (bVar1) {
          solveTasks(pcStack_15cd8);
        }
        if (bVar5) {
          solveSCIP(pcStack_15cd8);
          return 0;
        }
        if (bVar6) {
          if (pcStack_15ce0 != (char *)0x0) {
            solveMulti(pcStack_15cd8,pcStack_15ce0);
            return 0;
          }
          if ((dStack_15d20 == 0.0) && (!NAN(dStack_15d20))) {
            solveMulti(pcStack_15cd8,(char *)0x0);
            return 0;
          }
          HModel::HModel((HModel *)auStack_15cd0);
          auStack_15cd0[0] = 1;
          uStack_15cc0 = 1;
          dStack_15c90 = dStack_15d20;
          iVar10 = HModel::load_fromMPS((char *)auStack_15cd0);
          if (iVar10 == 0) {
            HModel::scaleModel();
            HDual::HDual((HDual *)auStack_14b40);
            HDual::solve((HModel *)auStack_14b40,(int)auStack_15cd0,2);
            HModel::util_reportSolverOutcome((char *)auStack_15cd0);
            HDual::~HDual((HDual *)auStack_14b40);
            HModel::~HModel((HModel *)auStack_15cd0);
            return 0;
          }
          HModel::~HModel((HModel *)auStack_15cd0);
          return iVar10;
        }
        if (((!bVar4 && !bVar3) && !bVar15) && !bVar7) {
          uVar11 = solvePlain(pcStack_15cd8);
          if (uVar11 == 0) {
            return 0;
          }
          printf("solvePlain(API) return code is %d\n",(ulong)uVar11);
          return 0;
        }
        if (((bVar4 || bVar3) || bVar7) || !bVar15) {
          solvePlainJAJH(pcStack_15cf8,pcStack_15d00,pcStack_15cf0,pcStack_15cd8,dStack_15ce8);
          return 0;
        }
        solvePlainWithPresolve(pcStack_15cd8);
        return 0;
      }
      if (iVar10 == 0x3f) {
        main_cold_1();
      }
      goto switchD_0010378c_caseD_67;
    }
    bVar5 = true;
    bVar9 = bVar1;
  }
  bVar9 = true;
  switch(iVar10) {
  case 99:
    pcStack_15d00 = _optarg;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Crash is set to ",0x10);
    pcVar8 = _optarg;
    if (_optarg == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10f188);
    }
    else {
      sVar12 = strlen(_optarg);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,sVar12);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
    bVar3 = true;
    bVar9 = bVar1;
    goto switchD_0010378c_caseD_73;
  case 100:
    debug = 1;
    bVar9 = bVar1;
    goto switchD_0010378c_caseD_73;
  case 0x65:
    pcStack_15cf8 = _optarg;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Edge weight is set to ",0x16);
    pcVar8 = _optarg;
    if (_optarg == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10f188);
    }
    else {
      sVar12 = strlen(_optarg);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,sVar12);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
    bVar4 = true;
    bVar9 = bVar1;
    goto switchD_0010378c_caseD_73;
  case 0x66:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Reading file ",0xd);
    pcVar8 = _optarg;
    if (_optarg == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10f188);
    }
    else {
      sVar12 = strlen(_optarg);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,sVar12);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
    pcStack_15cd8 = _optarg;
    bVar2 = true;
    bVar9 = bVar1;
    goto switchD_0010378c_caseD_73;
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6e:
  case 0x6f:
  case 0x71:
  case 0x72:
    goto switchD_0010378c_caseD_67;
  case 0x6d:
    bVar6 = true;
    bVar9 = bVar1;
    if (_optarg != (char *)0x0) {
      dStack_15d20 = atof(_optarg);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Pami cutoff = ",0xe)
      ;
      poVar13 = std::ostream::_M_insert<double>(dStack_15d20);
      cVar14 = (char)poVar13;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + cVar14);
      goto LAB_00103a10;
    }
    goto switchD_0010378c_caseD_73;
  case 0x70:
    bVar15 = false;
    if (*_optarg == 'O') {
      bVar15 = _optarg[1] == 'n';
    }
    pcStack_15cf0 = _optarg;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Presolve is set to ",0x13);
    break;
  case 0x73:
    goto switchD_0010378c_caseD_73;
  case 0x74:
    pcStack_15ce0 = _optarg;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Partition file is set to ",0x19);
    break;
  default:
    if (iVar10 != 0x54) goto switchD_0010378c_caseD_67;
    dStack_15ce8 = atof(_optarg);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Time limit is set to ",0x15);
    pcVar8 = _optarg;
    if (_optarg == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10f188);
    }
    else {
      sVar12 = strlen(_optarg);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,sVar12);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
    bVar7 = true;
    bVar9 = bVar1;
    goto switchD_0010378c_caseD_73;
  }
  pcVar8 = _optarg;
  if (_optarg == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10f188);
  }
  else {
    sVar12 = strlen(_optarg);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,sVar12);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  cVar14 = -0x78;
LAB_00103a10:
  std::ostream::put(cVar14);
  std::ostream::flush();
  bVar9 = bVar1;
  goto switchD_0010378c_caseD_73;
switchD_0010378c_caseD_67:
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  abort();
}

Assistant:

int main(int argc, char **argv) {
  int opt, filename=0, presolve=0, crash=0, edgeWeight=0, pami=0, sip=0, scip=0, timeLimit=0;
	double cut = 0;
	const char * fileName = "";
	const char * presolveMode = "";
	const char * edWtMode = "";
	const char * crashMode= "";
	const char * partitionFile = 0;
	double TimeLimit_ArgV = HSOL_CONST_INF;

#ifdef JAJH_dev
	cout <<"===================================================================================="<<endl;
	cout <<"Running hsol"<<endl;
#else
	cout <<"===================================================================================="<<endl;
	cout <<"Running hsol"<<endl;
#endif

	if (argc == 4 && strcmp(argv[1], "-repeat")==0) {
#ifdef JAJH_dev
	  HTester tester;
	  tester.setup(argv[2]);
	  tester.testUpdate(atoi(argv[3]));
#endif
	  return 0;
        }
	
	while ((opt = getopt(argc,argv,"p:c:e:sSm::t:T:df:")) != EOF)
	  switch(opt)
	    {
	    case 'f':
	      filename = 1;
	      cout <<"Reading file "<< optarg <<endl;
	      fileName = optarg;
	      break;
	    case 'p':
	      presolveMode = optarg;
	      presolve = (presolveMode[0]=='O' && presolveMode[1]=='n') ? 1 : 0;
	      cout <<"Presolve is set to "<< optarg <<endl;
	      break;
	    case 's':
	      sip = 1;
	      break;
	    case 'S':
	      scip = 1;
	      break;
	    case 'm':
	      pami = 1;
	      if (optarg) {
		cut = atof(optarg);
		cout<< "Pami cutoff = "<< cut<<endl;
	      }
	      break;
	    case 'd':
	      debug = 1;
	      break;
            case 'c':
	      crash = 1;
	      crashMode = optarg;
	      cout <<"Crash is set to "<< optarg <<endl;
	      break;
            case 'e':
	      edgeWeight = 1;
	      edWtMode = optarg;
	      cout <<"Edge weight is set to "<< optarg <<endl;
	      break;
	    case 't':
	      partitionFile = optarg;
	      cout <<"Partition file is set to "<< optarg <<endl;
	      break;
	    case 'T':
	      timeLimit = 1;
	      TimeLimit_ArgV = atof(optarg);
	      cout <<"Time limit is set to "<< optarg <<endl;
	      break;
            case '?':
	      if (opt == 'p')
		fprintf (stderr, "Option -%c requires an argument. Current options: Off On \n", opt);
	      if (opt == 'c')
		fprintf (stderr, "Option -%c requires an argument. Current options: Off LTSSF LTSSF1 LTSSF2 LTSSF3 LTSSF4 LTSSF5 LTSSF6 \n", opt);
	      if (opt == 'e')
		fprintf (stderr, "Option -%c requires an argument. Current options: Dan Dvx DSE DSE0 DSE1 \n", opt);
	      else
		fprintf(stderr, "usage: %s [options] -f fName.mps \n%s", argv[0],
			"Options: \n"
			"  -p On(Off): use presolve\n"
			"  -c mode   : set crash mode to mode. Values:\n"
			"            : Off LTSSF LTSSF1 LTSSF2 LTSSF3 LTSSF4 LTSSF5 LTSSF6 LTSSF7\n"
			"  -e edWt   : set edge weight to edWt. Values: \n"
			"            : Dan Dvx DSE DSE0 DSE1\n\n"
			"  -s        : use option sip\n"
			"  -S        : use option SCIP (to test utilities)\n"
			"  -m [cut]  : use pami. Cutoff optional double value.\n"
			"  -t fName  : use pami with partition file fName"
			"  -T time   : use a time limit"
			"  -d        : debug mode on\n");
	    default:
	      cout<<endl;
	      abort();
	    }
	//Set defaults
     if (!filename) {
       fileName = "ml.mps";
       printf("Setting default value filenameMode = %s\n", fileName);
     }
     if (!presolve) {
       presolveMode = "Off";
       printf("Setting default value presolveMode = %s\n", presolveMode);
     }
     if (!crash) {
       crashMode = "Off";
       printf("Setting default value crashMode = %s\n", crashMode);
     }
     if (!edgeWeight) {
       edWtMode = "DSE1";
       printf("Setting default value edWtMode = %s\n", edWtMode);
     }
    //parallel
    if (sip)
      solveTasks(fileName);
    if (scip)
      solveSCIP(fileName);
    else if (pami) {
    	if (partitionFile)
    		solveMulti(fileName, partitionFile);
    	else if (cut) {
            HModel model;
            model.intOption[INTOPT_PRINT_FLAG] = 1;
            model.intOption[INTOPT_PERMUTE_FLAG] = 1;
            model.dblOption[DBLOPT_PAMI_CUTOFF] = cut;
	    int RtCd = model.load_fromMPS(fileName);
	    if (RtCd) return RtCd;

	    model.scaleModel();
            HDual solver;
            solver.solve(&model, HDUAL_VARIANT_MULTI, 8);

            model.util_reportSolverOutcome("Cut");
        }
    	else
			solveMulti(fileName);
    }
    //serial
    else {
      if (!presolve && !crash && !edgeWeight && !timeLimit) {
	int RtCod = 
	//solvePlainAPI(fileName);
			solvePlain(fileName);
	if (RtCod != 0) {
	  printf("solvePlain(API) return code is %d\n", RtCod);
	}
      }
      else if (presolve && !crash && !edgeWeight && !timeLimit) {
	solvePlainWithPresolve(fileName);
	//solvePlainExperiments(fileName);
	//testIO("fileIO");
      }
      else
	solvePlainJAJH(edWtMode, crashMode, presolveMode, fileName, TimeLimit_ArgV);
    }

    return 0;
}